

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void __thiscall
kratos::Generator::add_named_block
          (Generator *this,string *block_name,shared_ptr<kratos::StmtBlock> *block)

{
  bool bVar1;
  StmtException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view format_str;
  format_args args;
  initializer_list<kratos::IRNode_*> __l;
  string local_80;
  element_type *local_60;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_58;
  size_type sStack_40;
  allocator_type local_29;
  
  bVar1 = has_named_block(this,block_name);
  if (!bVar1) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::StmtBlock>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::StmtBlock>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::StmtBlock>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::StmtBlock>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::StmtBlock>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->named_blocks_,block_name,block);
    return;
  }
  this_00 = (StmtException *)__cxa_allocate_exception(0x10);
  local_58.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(block_name->_M_dataplus)._M_p;
  local_58.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)block_name->_M_string_length;
  local_58.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(this->name)._M_dataplus._M_p;
  sStack_40 = (this->name)._M_string_length;
  bVar2 = fmt::v7::to_string_view<char,_0>("{0} already exists in {1}");
  format_str.data_ = (char *)bVar2.size_;
  format_str.size_ = 0xdd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_58;
  fmt::v7::detail::vformat_abi_cxx11_(&local_80,(detail *)bVar2.data_,format_str,args);
  local_60 = (block->super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_60;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_58,__l,&local_29);
  StmtException::StmtException(this_00,&local_80,&local_58);
  __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Generator::add_named_block(const std::string &block_name,
                                const std::shared_ptr<StmtBlock> &block) {
    if (has_named_block(block_name))
        throw StmtException(::format("{0} already exists in {1}", block_name, name), {block.get()});
    named_blocks_.emplace(block_name, block);
}